

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  TestMode *__args_1;
  aom_superblock_size *__args_2;
  aom_rc_mode *__args_3;
  __shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    __args_1 = (TestMode *)
               (**(code **)(*(long *)(this->current_).
                                     super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                                     ._M_head_impl.impl_._M_t.
                                     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                           + 0x28))();
    __args_2 = (aom_superblock_size *)
               (**(code **)(*(long *)(this->current_).
                                     super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                                     ._M_head_impl.impl_._M_t.
                                     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                           + 0x28))();
    __args_3 = (aom_rc_mode *)
               (**(code **)(*(long *)(this->current_).
                                     super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                     .
                                     super__Head_base<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_false>
                                     ._M_head_impl.impl_._M_t.
                                     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_superblock_size>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_superblock_size>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_superblock_size>_>_>
                                     .
                                     super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_false>
                           + 0x28))();
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                          .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                          super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>
                          ._M_head_impl.impl_ + 0x28))();
    std::
    make_shared<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_superblock_size,aom_rc_mode>,libaom_test::CodecFactory_const*const&,libaom_test::TestMode_const&,aom_superblock_size_const&,aom_rc_mode_const&>
              ((CodecFactory **)&_Stack_38,__args_1,__args_2,__args_3);
    std::
    __shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&(this->current_value_).
                 super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
                ,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }